

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkShaderStageFlags Diligent::ShaderTypesToVkShaderStageFlags(SHADER_TYPE ShaderTypes)

{
  type ShaderType;
  VkShaderStageFlagBits VVar1;
  VkShaderStageFlagBits local_10;
  SHADER_TYPE Type;
  VkShaderStageFlags Result;
  SHADER_TYPE ShaderTypes_local;
  
  local_10 = 0;
  Type = ShaderTypes;
  while (Type != SHADER_TYPE_UNKNOWN) {
    ShaderType = ExtractLSB<Diligent::SHADER_TYPE>(&Type);
    VVar1 = ShaderTypeToVkShaderStageFlagBit(ShaderType);
    local_10 = VVar1 | local_10;
  }
  return local_10;
}

Assistant:

VkShaderStageFlags ShaderTypesToVkShaderStageFlags(SHADER_TYPE ShaderTypes)
{
    VkShaderStageFlags Result = 0;
    while (ShaderTypes != SHADER_TYPE_UNKNOWN)
    {
        SHADER_TYPE Type = ExtractLSB(ShaderTypes);
        Result |= ShaderTypeToVkShaderStageFlagBit(Type);
    }
    return Result;
}